

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O3

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::pop_front(CircularArray<wabt::Token,_2UL> *this)

{
  undefined8 *puVar1;
  size_type sVar2;
  uint uVar3;
  ulong uVar4;
  
  sVar2 = this->size_;
  if (sVar2 != 0) {
    uVar3 = (uint)this->front_ & 1;
    uVar4 = (ulong)(uVar3 << 6);
    puVar1 = (undefined8 *)((long)&(this->contents_)._M_elems[0].loc.filename._M_str + uVar4 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(this->contents_)._M_elems[0].loc.filename._M_len + uVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&(this->contents_)._M_elems[0].token_type_ + uVar4) = 0;
    this->front_ = (ulong)uVar3 ^ 1;
    this->size_ = sVar2 - 1;
    return;
  }
  __assert_fail("size_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/circular-array.h"
                ,0x56,
                "void wabt::CircularArray<wabt::Token, 2>::pop_front() [T = wabt::Token, kCapacity = 2]"
               );
}

Assistant:

void pop_front() {
    assert(size_ > 0);
    SetElement(front());
    front_ = (front_ + 1) & kMask;
    --size_;
  }